

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSDDOMParser.cpp
# Opt level: O0

void __thiscall xercesc_4_0::XSDDOMParser::docComment(XSDDOMParser *this,XMLCh *comment)

{
  XMLCh *comment_local;
  XSDDOMParser *this_local;
  
  if (-1 < this->fAnnotationDepth) {
    XMLBuffer::append(&this->fAnnotationBuf,(XMLCh *)XMLUni::fgCommentString);
    XMLBuffer::append(&this->fAnnotationBuf,comment);
    XMLBuffer::append(&this->fAnnotationBuf,L'-');
    XMLBuffer::append(&this->fAnnotationBuf,L'-');
    XMLBuffer::append(&this->fAnnotationBuf,L'>');
  }
  return;
}

Assistant:

void XSDDOMParser::docComment(const XMLCh* const comment)
{
    if (fAnnotationDepth > -1)
    {
        fAnnotationBuf.append(XMLUni::fgCommentString);
        fAnnotationBuf.append(comment);
        fAnnotationBuf.append(chDash);
        fAnnotationBuf.append(chDash);
        fAnnotationBuf.append(chCloseAngle);
    }
}